

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

void mwWriteOF(void *p)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    *(uchar *)((long)p + lVar1) = "mEmwAtch"[lVar1];
  }
  return;
}

Assistant:

static void mwWriteOF(void *p)
{
	int i;
	unsigned char *ptr;
	ptr = (unsigned char *) p;
	for (i = 0; i < mwOverflowZoneSize; i++) {
		*(ptr + i) = mwOverflowZoneTemplate[i % 8];
	}
	return;
}